

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTActionEvents.cpp
# Opt level: O3

void TTD::NSLogEvents::CreateSymbol_Execute(EventLogEntry *evt,ThreadContextTTD *executeContext)

{
  ScriptContext *scriptContext;
  Var aValue;
  RecyclableObject *value;
  JavascriptString *description;
  JavascriptSymbol *result;
  
  scriptContext = ThreadContextTTD::GetActiveScriptContext(executeContext);
  if (scriptContext == (ScriptContext *)0x0) {
    TTDAbort_unrecoverable_error("This should be non-null!!!");
  }
  if (evt->EventKind == CreateSymbolActionTag) {
    aValue = InflateVarInReplay(executeContext,(TTDVar)evt[1].EventTimeStamp);
    if (aValue == (Var)0x0) {
      description = Js::JavascriptLibrary::GetEmptyString
                              ((scriptContext->super_ScriptContextBase).javascriptLibrary);
    }
    else {
      if ((ulong)aValue >> 0x30 == 0) {
        value = Js::VarTo<Js::RecyclableObject>(aValue);
        if ((((((value->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
            scriptContext.ptr != scriptContext) {
          aValue = Js::CrossSite::MarshalVar(scriptContext,value,false);
        }
      }
      description = Js::JavascriptConversion::ToString(aValue,scriptContext);
    }
    result = Js::JavascriptLibrary::CreateSymbol
                       ((scriptContext->super_ScriptContextBase).javascriptLibrary,description);
    JsRTActionHandleResultForReplay<TTD::NSLogEvents::JsRTVarsArgumentAction_InternalUse<1ul>,(TTD::NSLogEvents::EventKind)22>
              (executeContext,evt,result);
    return;
  }
  TTDAbort_unrecoverable_error("Bad tag match!");
}

Assistant:

void CreateSymbol_Execute(const EventLogEntry* evt, ThreadContextTTD* executeContext)
        {
            TTD_REPLAY_ACTIVE_CONTEXT(executeContext);
            const JsRTSingleVarArgumentAction* action = GetInlineEventDataAs<JsRTSingleVarArgumentAction, EventKind::CreateSymbolActionTag>(evt);
            Js::Var description = InflateVarInReplay(executeContext, GetVarItem_0(action));

            Js::JavascriptString* descriptionString;
            if(description != nullptr)
            {
                TTD_REPLAY_VALIDATE_INCOMING_REFERENCE(description, ctx);
                descriptionString = Js::JavascriptConversion::ToString(description, ctx);
            }
            else
            {
                descriptionString = ctx->GetLibrary()->GetEmptyString();
            }
            Js::Var res = ctx->GetLibrary()->CreateSymbol(descriptionString);

            JsRTActionHandleResultForReplay<JsRTSingleVarArgumentAction, EventKind::CreateSymbolActionTag>(executeContext, evt, res);
        }